

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall CaDiCaL::Solver::configure(Solver *this,char *name)

{
  bool bVar1;
  State *pSVar2;
  Solver *in_RSI;
  Solver *in_RDI;
  bool res;
  char *in_stack_00000030;
  Options *in_stack_00000038;
  char *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  
  if ((in_RDI->internal != (Internal *)0x0) && (in_RDI->trace_api_file != (FILE *)0x0)) {
    trace_api_call(in_RSI,(char *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),
                   &in_RDI->adding_clause);
  }
  require_solver_pointer_to_be_non_zero(in_RDI,in_stack_ffffffffffffffd8,(char *)0xe21230);
  if (in_RDI->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::configure(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"external solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  if (in_RDI->internal == (Internal *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::configure(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"internal solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  pSVar2 = state(in_RDI);
  if ((*pSVar2 & VALID) == 0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::configure(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"solver in invalid state");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  pSVar2 = state(in_RDI);
  if (*pSVar2 != CONFIGURING) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::configure(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"can only set configuration \'%s\' right after initialization",in_RSI);
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  bVar1 = Config::set(in_stack_00000038,in_stack_00000030);
  return bVar1;
}

Assistant:

bool Solver::configure (const char *name) {
  TRACE ("configure", name);
  LOG_API_CALL_BEGIN ("configure", name);
  REQUIRE_VALID_STATE ();
  REQUIRE (state () == CONFIGURING,
           "can only set configuration '%s' right after initialization",
           name);
  bool res = Config::set (internal->opts, name);
  LOG_API_CALL_END ("configure", name, res);
  return res;
}